

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsettings.cpp
# Opt level: O2

QVariant * QSettingsPrivate::stringToVariant(QVariant *__return_storage_ptr__,QString *s)

{
  char16_t cVar1;
  char16_t *pcVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Representation RVar8;
  Representation RVar9;
  Representation RVar10;
  Representation RVar11;
  pointer pQVar12;
  ulong uVar13;
  QSize s_00;
  QPoint pt;
  QArrayDataPointer<char> *this;
  long in_FS_OFFSET;
  QLatin1StringView s_01;
  QLatin1StringView s_02;
  QLatin1StringView s_03;
  QLatin1StringView s_04;
  QLatin1StringView s_05;
  QRect r;
  QLatin1StringView s_06;
  QLatin1StringView s_07;
  QLatin1StringView s_08;
  QArrayDataPointer<char> local_78;
  undefined1 local_58 [24];
  undefined1 *puStack_40;
  long local_30;
  
  this = &local_78;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = QString::startsWith(s,(QChar)0x40,CaseSensitive);
  if (bVar3) {
    bVar3 = QString::endsWith(s,(QChar)0x29,CaseSensitive);
    if (bVar3) {
      s_01.m_data = "@ByteArray(";
      s_01.m_size = 0xb;
      bVar3 = QString::startsWith(s,s_01,CaseSensitive);
      if (bVar3) {
        local_78.ptr = (char *)((s->d).ptr + 0xb);
        local_78.d = (Data *)((s->d).size + -0xc);
        this = (QArrayDataPointer<char> *)local_58;
        QStringView::toLatin1((QByteArray *)this,(QStringView *)&local_78);
        ::QVariant::QVariant(__return_storage_ptr__,(QByteArray *)this);
      }
      else {
        s_02.m_data = "@String(";
        s_02.m_size = 8;
        bVar3 = QString::startsWith(s,s_02,CaseSensitive);
        if (bVar3) {
          local_78.ptr = (char *)((s->d).ptr + 8);
          local_78.d = (Data *)((s->d).size + -9);
          QStringView::toString((QString *)local_58,(QStringView *)&local_78);
          ::QVariant::QVariant(__return_storage_ptr__,(QString *)local_58);
          goto LAB_003d669d;
        }
        s_03.m_data = "@Variant(";
        s_03.m_size = 9;
        bVar3 = QString::startsWith(s,s_03,CaseSensitive);
        if (!bVar3) {
          s_04.m_data = "@DateTime(";
          s_04.m_size = 10;
          bVar3 = QString::startsWith(s,s_04,CaseSensitive);
          if (!bVar3) {
            s_05.m_data = "@Rect(";
            s_05.m_size = 6;
            bVar3 = QString::startsWith(s,s_05,CaseSensitive);
            if (bVar3) {
              local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
              splitArgs((QStringList *)local_58,s,5);
              if ((undefined1 *)local_58._16_8_ != (undefined1 *)0x4) {
LAB_003d6659:
                QArrayDataPointer<QString>::~QArrayDataPointer
                          ((QArrayDataPointer<QString> *)local_58);
                goto LAB_003d6663;
              }
              pQVar12 = QList<QString>::data((QList<QString> *)local_58);
              iVar4 = QString::toInt(pQVar12,(bool *)0x0,10);
              pQVar12 = QList<QString>::data((QList<QString> *)local_58);
              iVar5 = QString::toInt(pQVar12 + 1,(bool *)0x0,10);
              pQVar12 = QList<QString>::data((QList<QString> *)local_58);
              iVar6 = QString::toInt(pQVar12 + 2,(bool *)0x0,10);
              pQVar12 = QList<QString>::data((QList<QString> *)local_58);
              iVar7 = QString::toInt(pQVar12 + 3,(bool *)0x0,10);
              r.x2.m_i = iVar4 + iVar6 + -1;
              r.y1.m_i = iVar5;
              r.x1.m_i = iVar4;
              r.y2.m_i = iVar7 + iVar5 + -1;
              ::QVariant::QVariant(__return_storage_ptr__,r);
            }
            else {
              s_06.m_data = "@Size(";
              s_06.m_size = 6;
              bVar3 = QString::startsWith(s,s_06,CaseSensitive);
              if (bVar3) {
                local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
                local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
                splitArgs((QStringList *)local_58,s,5);
                if ((undefined1 *)local_58._16_8_ != (undefined1 *)0x2) goto LAB_003d6659;
                pQVar12 = QList<QString>::data((QList<QString> *)local_58);
                RVar8.m_i = QString::toInt(pQVar12,(bool *)0x0,10);
                pQVar12 = QList<QString>::data((QList<QString> *)local_58);
                RVar9.m_i = QString::toInt(pQVar12 + 1,(bool *)0x0,10);
                s_00.ht.m_i = RVar9.m_i;
                s_00.wd.m_i = RVar8.m_i;
                ::QVariant::QVariant(__return_storage_ptr__,s_00);
              }
              else {
                s_07.m_data = "@Point(";
                s_07.m_size = 7;
                bVar3 = QString::startsWith(s,s_07,CaseSensitive);
                if (!bVar3) {
                  local_58._0_8_ = (Data *)0xa;
                  local_58._8_8_ = "@Invalid()";
                  bVar3 = ::operator==(s,(QLatin1StringView *)local_58);
                  if (bVar3) {
                    (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
                    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
                    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
                    *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
                    goto LAB_003d66af;
                  }
                  goto LAB_003d6663;
                }
                local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
                local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
                splitArgs((QStringList *)local_58,s,6);
                if ((undefined1 *)local_58._16_8_ != (undefined1 *)0x2) goto LAB_003d6659;
                pQVar12 = QList<QString>::data((QList<QString> *)local_58);
                RVar10.m_i = QString::toInt(pQVar12,(bool *)0x0,10);
                pQVar12 = QList<QString>::data((QList<QString> *)local_58);
                RVar11.m_i = QString::toInt(pQVar12 + 1,(bool *)0x0,10);
                pt.yp.m_i = RVar11.m_i;
                pt.xp.m_i = RVar10.m_i;
                ::QVariant::QVariant(__return_storage_ptr__,pt);
              }
            }
            QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_58);
            goto LAB_003d66af;
          }
        }
        pcVar2 = (s->d).ptr;
        cVar1 = pcVar2[1];
        uVar13 = (ulong)(cVar1 == L'D');
        local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_78.ptr = &DAT_aaaaaaaaaaaaaaaa;
        local_58._0_8_ = (s->d).size - (uVar13 + 9);
        local_58._8_8_ = pcVar2 + uVar13 + 9;
        QStringView::toLatin1((QByteArray *)&local_78,(QStringView *)local_58);
        local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
        local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QDataStream::QDataStream((QDataStream *)local_58,(QByteArray *)&local_78,(OpenMode)0x1);
        iVar4 = 7;
        if (cVar1 == L'D') {
          iVar4 = 0x11;
        }
        puStack_40 = (undefined1 *)CONCAT44(puStack_40._4_4_,iVar4);
        (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
        *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
        *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
        *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
        ::operator>>((QDataStream *)local_58,__return_storage_ptr__);
        QDataStream::~QDataStream((QDataStream *)local_58);
      }
      QArrayDataPointer<char>::~QArrayDataPointer(this);
      goto LAB_003d66af;
    }
LAB_003d6663:
    s_08.m_data = "@@";
    s_08.m_size = 2;
    bVar3 = QString::startsWith(s,s_08,CaseSensitive);
    if (bVar3) {
      QString::sliced((QString *)local_58,s,1);
      ::QVariant::QVariant(__return_storage_ptr__,(QString *)local_58);
LAB_003d669d:
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_58);
      goto LAB_003d66af;
    }
  }
  ::QVariant::QVariant(__return_storage_ptr__,s);
LAB_003d66af:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QSettingsPrivate::stringToVariant(const QString &s)
{
    if (s.startsWith(u'@')) {
        if (s.endsWith(u')')) {
            if (s.startsWith("@ByteArray("_L1)) {
                return QVariant(QStringView{s}.sliced(11).chopped(1).toLatin1());
            } else if (s.startsWith("@String("_L1)) {
                return QVariant(QStringView{s}.sliced(8).chopped(1).toString());
            } else if (s.startsWith("@Variant("_L1)
                       || s.startsWith("@DateTime("_L1)) {
#ifndef QT_NO_DATASTREAM
                QDataStream::Version version;
                int offset;
                if (s.at(1) == u'D') {
                    version = QDataStream::Qt_5_6;
                    offset = 10;
                } else {
                    version = QDataStream::Qt_4_0;
                    offset = 9;
                }
                QByteArray a = QStringView{s}.sliced(offset).toLatin1();
                QDataStream stream(&a, QIODevice::ReadOnly);
                stream.setVersion(version);
                QVariant result;
                stream >> result;
                return result;
#else
                Q_ASSERT(!"QSettings: Cannot load custom types without QDataStream support");
#endif
            } else if (s.startsWith("@Rect("_L1)) {
                QStringList args = QSettingsPrivate::splitArgs(s, 5);
                if (args.size() == 4)
                    return QVariant(QRect(args[0].toInt(), args[1].toInt(), args[2].toInt(), args[3].toInt()));
            } else if (s.startsWith("@Size("_L1)) {
                QStringList args = QSettingsPrivate::splitArgs(s, 5);
                if (args.size() == 2)
                    return QVariant(QSize(args[0].toInt(), args[1].toInt()));
            } else if (s.startsWith("@Point("_L1)) {
                QStringList args = QSettingsPrivate::splitArgs(s, 6);
                if (args.size() == 2)
                    return QVariant(QPoint(args[0].toInt(), args[1].toInt()));
            } else if (s == "@Invalid()"_L1) {
                return QVariant();
            }

        }
        if (s.startsWith("@@"_L1))
            return QVariant(s.sliced(1));
    }

    return QVariant(s);
}